

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

void __thiscall luna::Table::MergeFromHashToArray(Table *this)

{
  bool bVar1;
  Value *unaff_retaddr;
  Value key;
  size_t index;
  anon_union_8_9_8deb4486_for_Value_0 in_stack_ffffffffffffffe0;
  
  ArraySize(in_stack_ffffffffffffffe0.table_);
  Value::Value((Value *)&stack0xffffffffffffffe0);
  do {
    bVar1 = MoveHashToArray(key.field_0.table_,unaff_retaddr);
  } while (bVar1);
  return;
}

Assistant:

void Table::MergeFromHashToArray()
    {
        auto index = ArraySize();
        Value key;
        key.num_ = ++index;
        key.type_ = ValueT_Number;

        while (MoveHashToArray(key))
            key.num_ = ++index;
    }